

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O2

void __thiscall tcmalloc::SymbolizePrinter::OnePC(SymbolizePrinter *this,uintptr_t pc)

{
  if (this->state_ == (backtrace_state *)0x0) {
    DemangleAndPrint(this,pc,(char *)0x0,0,(char *)0x0,0);
    return;
  }
  this->pc_ = pc;
  this->want_syminfo_ = false;
  tcmalloc_backtrace_pcinfo(this->state_,pc,pcinfo_success,pcinfo_error,this);
  if (this->want_syminfo_ == true) {
    tcmalloc_backtrace_syminfo(this->state_,pc,syminfo_success,syminfo_error,this);
    return;
  }
  return;
}

Assistant:

void OnePC(uintptr_t pc) {
    if (!state_) {
      DemangleAndPrint(pc, nullptr, 0, nullptr, 0);
      return;
    }

    pc_ = pc;
    want_syminfo_ = false;
    tcmalloc_backtrace_pcinfo(state_, pc,
                              &pcinfo_success,
                              &pcinfo_error,
                              this);
    if (want_syminfo_) {
      tcmalloc_backtrace_syminfo(state_, pc,
                                 &syminfo_success,
                                 &syminfo_error,
                                 this);
    }
  }